

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.hh
# Opt level: O2

void __thiscall OB::Parg::~Parg(Parg *this)

{
  std::__cxx11::string::~string((string *)&this->error_);
  std::__cxx11::string::~string((string *)&this->stdin_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->positional_vec_);
  std::__cxx11::string::~string((string *)&this->positional_);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&(this->flags_)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OB::Parg::Option>_>_>
  ::~_Rb_tree(&(this->data_)._M_t);
  std::__cxx11::string::~string((string *)&this->author_);
  std::vector<OB::Parg::info_pair,_std::allocator<OB::Parg::info_pair>_>::~vector(&this->info_);
  std::__cxx11::string::~string((string *)&this->options_);
  std::__cxx11::string::~string((string *)&this->modes_);
  std::__cxx11::string::~string((string *)&this->description_);
  std::__cxx11::string::~string((string *)&this->usage_);
  std::__cxx11::string::~string((string *)&this->version_);
  std::__cxx11::string::~string((string *)&this->name_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->argv_);
  return;
}

Assistant:

Parg()
  {
  }